

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

void __thiscall HTTPSession::HTTPSession(HTTPSession *this,Socket *in_sock)

{
  rep rVar1;
  Socket *in_sock_local;
  HTTPSession *this_local;
  
  Jupiter::Socket::Socket(&this->sock,in_sock);
  std::__cxx11::string::string((string *)&this->request);
  this->keep_alive = false;
  this->host = (Host *)0x0;
  this->version = HTTP_1_0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->last_active).__d.__r = rVar1;
  return;
}

Assistant:

HTTPSession::HTTPSession(Jupiter::Socket&& in_sock)
	: sock(std::move(in_sock)) {
}